

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiagObjectModel.cpp
# Opt level: O0

void __thiscall
Js::RecyclableCollectionObjectWalker<Js::JavascriptWeakMap>::GetChildren
          (RecyclableCollectionObjectWalker<Js::JavascriptWeakMap> *this)

{
  JavascriptWeakMap *this_00;
  JavascriptWeakMap *data;
  RecyclableCollectionObjectWalker<Js::JavascriptWeakMap> *this_local;
  
  this_00 = VarTo<Js::JavascriptWeakMap>(this->instance);
  JavascriptWeakMap::
  Map<Js::RecyclableCollectionObjectWalker<Js::JavascriptWeakMap>::GetChildren()::__0>
            (this_00,(anon_class_8_1_8991fb9c)this);
  return;
}

Assistant:

void RecyclableCollectionObjectWalker<JavascriptWeakMap>::GetChildren()
    {
        JavascriptWeakMap* data = VarTo<JavascriptWeakMap>(instance);
        data->Map([&](Var key, Var value)
        {
            propertyList->Add(RecyclableCollectionObjectWalkerPropertyData<JavascriptWeakMap>(key, value));
        });
    }